

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

Expression * __thiscall MathInterpreter::interpret(MathInterpreter *this,string *input_arg)

{
  Expression *pEVar1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar2;
  Expression *e;
  string local_38;
  string *local_18;
  string *input_arg_local;
  MathInterpreter *this_local;
  
  local_18 = input_arg;
  input_arg_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)input_arg);
  separateInput(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  fromInfixToPostfix(this);
  pEVar1 = fromStringToExpression(this);
  plVar2 = this->input;
  if (plVar2 != (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list(plVar2);
    operator_delete(plVar2,0x18);
  }
  plVar2 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  memset(plVar2,0,0x18);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(plVar2);
  this->input = plVar2;
  return pEVar1;
}

Assistant:

Expression *MathInterpreter::interpret(string input_arg) {
  this->separateInput(input_arg);
  this->fromInfixToPostfix();
  Expression *e = this->fromStringToExpression();
  delete this->input;
  this->input = new list<string>();
  return e;
}